

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm1d.c
# Opt level: O2

void av1_fdct16(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined7 in_register_00000011;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int32_t step [16];
  
  av1_range_check_buf(0,input,input,0x10,*stage_range);
  *output = input[0xf] + *input;
  output[1] = input[0xe] + input[1];
  output[2] = input[0xd] + input[2];
  output[3] = input[0xc] + input[3];
  output[4] = input[0xb] + input[4];
  output[5] = input[10] + input[5];
  output[6] = input[9] + input[6];
  output[7] = input[8] + input[7];
  output[8] = input[7] - input[8];
  output[9] = input[6] - input[9];
  output[10] = input[5] - input[10];
  output[0xb] = input[4] - input[0xb];
  output[0xc] = input[3] - input[0xc];
  output[0xd] = input[2] - input[0xd];
  output[0xe] = input[1] - input[0xe];
  output[0xf] = *input - input[0xf];
  av1_range_check_buf(1,input,output,0x10,stage_range[1]);
  lVar7 = (long)(int)CONCAT71(in_register_00000011,cos_bit) * 0x100;
  step[0] = output[7] + *output;
  step[1] = output[6] + output[1];
  step[2] = output[5] + output[2];
  step[3] = output[4] + output[3];
  step[4] = output[3] - output[4];
  step[5] = output[2] - output[5];
  step[6] = output[1] - output[6];
  step[7] = *output - output[7];
  step._32_8_ = *(undefined8 *)(output + 8);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x1e0);
  lVar12 = (long)iVar1;
  iVar13 = -iVar1;
  lVar9 = 1L << (cos_bit - 1U & 0x3f);
  lVar8 = output[0xd] * lVar12 + lVar9;
  step[10] = (int32_t)(output[10] * iVar13 + lVar8 >> (cos_bit & 0x3fU));
  lVar11 = output[0xc] * lVar12 + lVar9;
  step[0xb] = (int32_t)(output[0xb] * iVar13 + lVar11 >> (cos_bit & 0x3fU));
  step[0xc] = (int32_t)(output[0xb] * iVar1 + lVar11 >> (cos_bit & 0x3fU));
  step[0xd] = (int32_t)(output[10] * iVar1 + lVar8 >> (cos_bit & 0x3fU));
  step._56_8_ = *(undefined8 *)(output + 0xe);
  av1_range_check_buf(2,input,step,0x10,stage_range[2]);
  *output = step[3] + step[0];
  output[1] = step[2] + step[1];
  output[2] = step[1] - step[2];
  output[3] = step[0] - step[3];
  output[4] = step[4];
  lVar8 = step[6] * lVar12 + lVar9;
  output[5] = (int32_t)(step[5] * iVar13 + lVar8 >> (cos_bit & 0x3fU));
  output[6] = (int32_t)(step[5] * iVar1 + lVar8 >> (cos_bit & 0x3fU));
  output[7] = step[7];
  output[8] = step[0xb] + step[8];
  output[9] = step[10] + step[9];
  output[10] = step[9] - step[10];
  output[0xb] = step[8] - step[0xb];
  output[0xc] = step[0xf] - step[0xc];
  output[0xd] = step[0xe] - step[0xd];
  output[0xe] = step[0xe] + step[0xd];
  output[0xf] = step[0xf] + step[0xc];
  av1_range_check_buf(3,input,output,0x10,stage_range[3]);
  lVar8 = *output * lVar12 + lVar9;
  step[1] = (int32_t)(iVar13 * output[1] + lVar8 >> (cos_bit & 0x3fU));
  step[0] = (int32_t)(output[1] * iVar1 + lVar8 >> (cos_bit & 0x3fU));
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x220);
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x1a0);
  iVar10 = -iVar13;
  step[3] = (int32_t)(output[3] * iVar1 + lVar9 + (long)(output[2] * iVar10) >> (cos_bit & 0x3fU));
  step[2] = (int32_t)(output[2] * iVar1 + lVar9 + (long)(output[3] * iVar13) >> (cos_bit & 0x3fU));
  step[4] = output[5] + output[4];
  step[7] = output[6] + output[7];
  step[5] = output[4] - output[5];
  step[6] = output[7] - output[6];
  step[8] = output[8];
  step[9] = (int32_t)(output[0xe] * iVar1 + lVar9 + (long)(output[9] * iVar10) >> (cos_bit & 0x3fU))
  ;
  step[10] = (int32_t)(-(iVar1 * output[10]) + lVar9 + (long)(output[0xd] * iVar10) >>
                      (cos_bit & 0x3fU));
  step._44_8_ = *(undefined8 *)(output + 0xb);
  step[0xd] = (int32_t)(output[0xd] * iVar1 + lVar9 + (long)(iVar10 * output[10]) >>
                       (cos_bit & 0x3fU));
  step[0xe] = (int32_t)(output[9] * iVar1 + lVar9 + (long)(output[0xe] * iVar13) >>
                       (cos_bit & 0x3fU));
  step[0xf] = output[0xf];
  av1_range_check_buf(4,input,step,0x10,stage_range[4]);
  *(undefined8 *)output = step._0_8_;
  *(undefined8 *)(output + 2) = step._8_8_;
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x240);
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x180);
  iVar10 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x170);
  output[4] = (int32_t)(step[4] * iVar1 + lVar9 + (long)(step[7] * iVar13) >> (cos_bit & 0x3fU));
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x1c0);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x200);
  output[5] = (int32_t)(step[5] * iVar2 + lVar9 + (long)(step[6] * iVar3) >> (cos_bit & 0x3fU));
  output[6] = (int32_t)(step[6] * iVar2 + lVar9 + (long)-(step[5] * iVar3) >> (cos_bit & 0x3fU));
  output[7] = (int32_t)(step[7] * iVar1 + lVar9 + (long)-(step[4] * iVar13) >> (cos_bit & 0x3fU));
  output[8] = step[9] + step[8];
  output[9] = step[8] - step[9];
  output[10] = step[0xb] - step[10];
  output[0xb] = step[10] + step[0xb];
  output[0xc] = step[0xd] + step[0xc];
  output[0xd] = step[0xc] - step[0xd];
  output[0xe] = step[0xf] - step[0xe];
  output[0xf] = step[0xe] + step[0xf];
  av1_range_check_buf(5,input,output,0x10,stage_range[5]);
  step._0_8_ = *(undefined8 *)output;
  step._8_8_ = *(undefined8 *)(output + 2);
  step._16_8_ = *(undefined8 *)(output + 4);
  step._24_8_ = *(undefined8 *)(output + 6);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x250);
  step[8] = (int32_t)(output[8] * iVar1 + lVar9 + (long)(output[0xf] * iVar10) >> (cos_bit & 0x3fU))
  ;
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x1d0);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x1f0);
  step[9] = (int32_t)(output[9] * iVar13 + lVar9 + (long)(output[0xe] * iVar2) >> (cos_bit & 0x3fU))
  ;
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x210);
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x1b0);
  step[10] = (int32_t)(output[10] * iVar3 + lVar9 + (long)(output[0xd] * iVar4) >> (cos_bit & 0x3fU)
                      );
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar7 + 400);
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x230);
  step[0xb] = (int32_t)(output[0xb] * iVar5 + lVar9 + (long)(output[0xc] * iVar6) >>
                       (cos_bit & 0x3fU));
  step[0xc] = (int32_t)(output[0xc] * iVar5 + lVar9 + (long)-(output[0xb] * iVar6) >>
                       (cos_bit & 0x3fU));
  step[0xd] = (int32_t)(output[0xd] * iVar3 + lVar9 + (long)-(output[10] * iVar4) >>
                       (cos_bit & 0x3fU));
  step[0xe] = (int32_t)(output[0xe] * iVar13 + lVar9 + (long)-(output[9] * iVar2) >>
                       (cos_bit & 0x3fU));
  step[0xf] = (int32_t)(output[0xf] * iVar1 + lVar9 + (long)-(output[8] * iVar10) >>
                       (cos_bit & 0x3fU));
  av1_range_check_buf(6,input,step,0x10,stage_range[6]);
  *output = step[0];
  output[1] = step[8];
  output[2] = step[4];
  output[3] = step[0xc];
  output[4] = step[2];
  output[5] = step[10];
  output[6] = step[6];
  output[7] = step[0xe];
  output[8] = step[1];
  output[9] = step[9];
  output[10] = step[5];
  output[0xb] = step[0xd];
  output[0xc] = step[3];
  output[0xd] = step[0xb];
  output[0xe] = step[7];
  output[0xf] = step[0xf];
  av1_range_check_buf(7,input,output,0x10,stage_range[7]);
  return;
}

Assistant:

void av1_fdct16(const int32_t *input, int32_t *output, int8_t cos_bit,
                const int8_t *stage_range) {
  const int32_t size = 16;
  const int32_t *cospi;

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[16];

  // stage 0;
  av1_range_check_buf(stage, input, input, size, stage_range[stage]);

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[0] + input[15];
  bf1[1] = input[1] + input[14];
  bf1[2] = input[2] + input[13];
  bf1[3] = input[3] + input[12];
  bf1[4] = input[4] + input[11];
  bf1[5] = input[5] + input[10];
  bf1[6] = input[6] + input[9];
  bf1[7] = input[7] + input[8];
  bf1[8] = -input[8] + input[7];
  bf1[9] = -input[9] + input[6];
  bf1[10] = -input[10] + input[5];
  bf1[11] = -input[11] + input[4];
  bf1[12] = -input[12] + input[3];
  bf1[13] = -input[13] + input[2];
  bf1[14] = -input[14] + input[1];
  bf1[15] = -input[15] + input[0];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0] + bf0[7];
  bf1[1] = bf0[1] + bf0[6];
  bf1[2] = bf0[2] + bf0[5];
  bf1[3] = bf0[3] + bf0[4];
  bf1[4] = -bf0[4] + bf0[3];
  bf1[5] = -bf0[5] + bf0[2];
  bf1[6] = -bf0[6] + bf0[1];
  bf1[7] = -bf0[7] + bf0[0];
  bf1[8] = bf0[8];
  bf1[9] = bf0[9];
  bf1[10] = half_btf(-cospi[32], bf0[10], cospi[32], bf0[13], cos_bit);
  bf1[11] = half_btf(-cospi[32], bf0[11], cospi[32], bf0[12], cos_bit);
  bf1[12] = half_btf(cospi[32], bf0[12], cospi[32], bf0[11], cos_bit);
  bf1[13] = half_btf(cospi[32], bf0[13], cospi[32], bf0[10], cos_bit);
  bf1[14] = bf0[14];
  bf1[15] = bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0] + bf0[3];
  bf1[1] = bf0[1] + bf0[2];
  bf1[2] = -bf0[2] + bf0[1];
  bf1[3] = -bf0[3] + bf0[0];
  bf1[4] = bf0[4];
  bf1[5] = half_btf(-cospi[32], bf0[5], cospi[32], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[32], bf0[6], cospi[32], bf0[5], cos_bit);
  bf1[7] = bf0[7];
  bf1[8] = bf0[8] + bf0[11];
  bf1[9] = bf0[9] + bf0[10];
  bf1[10] = -bf0[10] + bf0[9];
  bf1[11] = -bf0[11] + bf0[8];
  bf1[12] = -bf0[12] + bf0[15];
  bf1[13] = -bf0[13] + bf0[14];
  bf1[14] = bf0[14] + bf0[13];
  bf1[15] = bf0[15] + bf0[12];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[32], bf0[0], cospi[32], bf0[1], cos_bit);
  bf1[1] = half_btf(-cospi[32], bf0[1], cospi[32], bf0[0], cos_bit);
  bf1[2] = half_btf(cospi[48], bf0[2], cospi[16], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[48], bf0[3], -cospi[16], bf0[2], cos_bit);
  bf1[4] = bf0[4] + bf0[5];
  bf1[5] = -bf0[5] + bf0[4];
  bf1[6] = -bf0[6] + bf0[7];
  bf1[7] = bf0[7] + bf0[6];
  bf1[8] = bf0[8];
  bf1[9] = half_btf(-cospi[16], bf0[9], cospi[48], bf0[14], cos_bit);
  bf1[10] = half_btf(-cospi[48], bf0[10], -cospi[16], bf0[13], cos_bit);
  bf1[11] = bf0[11];
  bf1[12] = bf0[12];
  bf1[13] = half_btf(cospi[48], bf0[13], -cospi[16], bf0[10], cos_bit);
  bf1[14] = half_btf(cospi[16], bf0[14], cospi[48], bf0[9], cos_bit);
  bf1[15] = bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[56], bf0[4], cospi[8], bf0[7], cos_bit);
  bf1[5] = half_btf(cospi[24], bf0[5], cospi[40], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[24], bf0[6], -cospi[40], bf0[5], cos_bit);
  bf1[7] = half_btf(cospi[56], bf0[7], -cospi[8], bf0[4], cos_bit);
  bf1[8] = bf0[8] + bf0[9];
  bf1[9] = -bf0[9] + bf0[8];
  bf1[10] = -bf0[10] + bf0[11];
  bf1[11] = bf0[11] + bf0[10];
  bf1[12] = bf0[12] + bf0[13];
  bf1[13] = -bf0[13] + bf0[12];
  bf1[14] = -bf0[14] + bf0[15];
  bf1[15] = bf0[15] + bf0[14];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 6
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = bf0[6];
  bf1[7] = bf0[7];
  bf1[8] = half_btf(cospi[60], bf0[8], cospi[4], bf0[15], cos_bit);
  bf1[9] = half_btf(cospi[28], bf0[9], cospi[36], bf0[14], cos_bit);
  bf1[10] = half_btf(cospi[44], bf0[10], cospi[20], bf0[13], cos_bit);
  bf1[11] = half_btf(cospi[12], bf0[11], cospi[52], bf0[12], cos_bit);
  bf1[12] = half_btf(cospi[12], bf0[12], -cospi[52], bf0[11], cos_bit);
  bf1[13] = half_btf(cospi[44], bf0[13], -cospi[20], bf0[10], cos_bit);
  bf1[14] = half_btf(cospi[28], bf0[14], -cospi[36], bf0[9], cos_bit);
  bf1[15] = half_btf(cospi[60], bf0[15], -cospi[4], bf0[8], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 7
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0];
  bf1[1] = bf0[8];
  bf1[2] = bf0[4];
  bf1[3] = bf0[12];
  bf1[4] = bf0[2];
  bf1[5] = bf0[10];
  bf1[6] = bf0[6];
  bf1[7] = bf0[14];
  bf1[8] = bf0[1];
  bf1[9] = bf0[9];
  bf1[10] = bf0[5];
  bf1[11] = bf0[13];
  bf1[12] = bf0[3];
  bf1[13] = bf0[11];
  bf1[14] = bf0[7];
  bf1[15] = bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);
}